

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O2

void __thiscall
perfetto::internal::TrackRegistry::SerializeTrack<perfetto::CounterTrack>
          (TrackRegistry *this,CounterTrack *track,
          MessageHandle<perfetto::protos::pbzero::TracePacket> *packet)

{
  Message *this_00;
  iterator iVar1;
  TrackDescriptor *desc;
  lock_guard<std::mutex> lock;
  string desc_copy;
  MessageHandleBase local_40;
  SerializedTrackDescriptor local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  ::std::mutex::lock((mutex *)this);
  iVar1 = ::std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&this->tracks_,(key_type *)track);
  if ((_Rb_tree_header *)iVar1._M_node != &(this->tracks_)._M_t._M_impl.super__Rb_tree_header) {
    ::std::__cxx11::string::_M_assign((string *)&local_38);
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  this_00 = (packet->super_MessageHandleBase).message_;
  if (local_38._M_string_length == 0) {
    desc = protos::pbzero::TracePacket::
           set_track_descriptor<perfetto::protos::pbzero::TrackDescriptor>((TracePacket *)this_00);
    CounterTrack::Serialize(track,desc);
  }
  else {
    (packet->super_MessageHandleBase).message_ = (Message *)0x0;
    local_40.message_ = this_00;
    WriteTrackDescriptor
              (&local_38,(MessageHandle<perfetto::protos::pbzero::TracePacket> *)&local_40);
    protozero::MessageHandleBase::~MessageHandleBase(&local_40);
  }
  ::std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void SerializeTrack(
      const TrackType& track,
      protozero::MessageHandle<protos::pbzero::TracePacket> packet) {
    // If the track has extra metadata (recorded with UpdateTrack), it will be
    // found in the registry. To minimize the time the lock is held, make a copy
    // of the data held in the registry and write it outside the lock.
    std::string desc_copy;
    {
      std::lock_guard<std::mutex> lock(mutex_);
      const auto& it = tracks_.find(track.uuid);
      if (it != tracks_.end()) {
        desc_copy = it->second;
        PERFETTO_DCHECK(!desc_copy.empty());
      }
    }
    if (!desc_copy.empty()) {
      WriteTrackDescriptor(std::move(desc_copy), std::move(packet));
    } else {
      // Otherwise we just write the basic descriptor for this type of track
      // (e.g., just uuid, no name).
      track.Serialize(packet->set_track_descriptor());
    }
  }